

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_6::GetTerminalAttributeImpl
               (Stage *stage,Prim *prim,string *attr_name,Attribute *value,string *err,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *visited_paths)

{
  undefined8 prim_00;
  bool bVar1;
  ostream *poVar2;
  const_iterator cVar3;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  char *pcVar6;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  targetPrimRet;
  string abs_path;
  value_type target;
  string targetPrimPropName;
  string targetPrimPath;
  ostringstream ss_e;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> pv;
  Property prop;
  undefined1 local_960 [16];
  undefined1 local_950 [64];
  undefined1 local_910 [176];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_860 [2];
  string local_840;
  string local_820;
  _Alloc_hider local_800;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f0;
  string local_7e0;
  undefined1 local_7c0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_790;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_770;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_760;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_750;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_740;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_730;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_710 [12];
  string local_648;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_628;
  Property local_610;
  
  local_950._24_8_ = stage;
  Property::Property(&local_610);
  args = err;
  bVar1 = GetProperty(prim,attr_name,&local_610,err);
  if (bVar1) {
    if ((local_610._type < Relation) &&
       (bVar1 = Attribute::is_connection(&local_610._attrib), bVar1)) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                (&local_628,&local_610._attrib._paths);
      if (local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7c0,"GetTerminalAttributeImpl",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"():",3);
        poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_7c0,0xae3);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        local_960._0_8_ = (Prim *)local_950;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_960,"Connection targetPath is empty for Attribute {}.","");
        fmt::format<std::__cxx11::string>
                  ((string *)local_910,(fmt *)local_960,(string *)attr_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_7c0,(char *)local_910._0_8_,local_910._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
          operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
        }
        bVar1 = (Prim *)local_960._0_8_ == (Prim *)local_950;
LAB_00322a1f:
        if (!bVar1) {
          operator_delete((void *)local_960._0_8_,(ulong)(local_950._0_8_ + 1));
        }
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)err,local_910._0_8_);
          if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
            operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
          }
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c0);
        ::std::ios_base::~ios_base((ios_base *)local_750._M_local_buf);
        bVar1 = false;
      }
      else {
        if (1 < (ulong)(((long)local_628.
                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_628.
                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 4) * 0x4ec4ec4ec4ec4ec5))
        {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7c0,"GetTerminalAttributeImpl",0x18);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"():",3);
          poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_7c0,0xae8);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          local_960._0_8_ = (Prim *)local_950;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_960,"Multiple targetPaths assigned to .connection.","");
          fmt::format((string *)local_910,(string *)local_960);
          poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_7c0,(char *)local_910._0_8_,local_910._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
            operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
          }
          bVar1 = (Prim *)local_960._0_8_ == (Prim *)local_950;
          goto LAB_00322a1f;
        }
        Path::Path((Path *)local_910,
                   local_628.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7e0,local_910._0_8_,(char *)(local_910._0_8_ + local_910._8_8_))
        ;
        local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_840,local_910._32_8_,
                   (pointer)(local_910._32_8_ + local_910._40_8_));
        local_950._32_8_ = local_950 + 0x30;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)(local_950 + 0x20),"");
        Path::Path((Path *)local_7c0,&local_7e0,(string *)(local_950 + 0x20));
        Stage::GetPrimAtPath_abi_cxx11_
                  ((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_960,(Stage *)local_950._24_8_,(Path *)local_7c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_allocated_capacity != local_710) {
          operator_delete((void *)local_720._M_allocated_capacity,
                          (ulong)(local_710[0]._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_740._M_allocated_capacity != &local_730) {
          operator_delete((void *)local_740._M_allocated_capacity,
                          (ulong)(local_730._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_760._M_allocated_capacity != &local_750) {
          operator_delete((void *)local_760._M_allocated_capacity,
                          (ulong)(local_750._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_780._M_allocated_capacity != &local_770) {
          operator_delete((void *)local_780._M_allocated_capacity,
                          (ulong)(local_770._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c0._32_8_ != &local_790) {
          operator_delete((void *)local_7c0._32_8_,(ulong)(local_790._M_allocated_capacity + 1));
        }
        if (local_7c0._0_8_ != (long)local_7c0 + 0x10) {
          operator_delete((void *)local_7c0._0_8_,(ulong)(local_7c0._16_8_ + 1));
        }
        if ((undefined1 *)local_950._32_8_ != local_950 + 0x30) {
          operator_delete((void *)local_950._32_8_,local_950._48_8_ + 1);
        }
        prim_00 = local_960._0_8_;
        if (local_950[0x10] == '\x01') {
          Path::full_path_name_abi_cxx11_((string *)(local_950 + 0x20),(Path *)local_910);
          cVar3 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)visited_paths,(string *)(local_950 + 0x20));
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(visited_paths->_M_t)._M_impl.super__Rb_tree_header;
          if (cVar3._M_node == (_Base_ptr)pbVar4) {
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)visited_paths,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_950 + 0x20));
            bVar1 = GetTerminalAttributeImpl
                              ((Stage *)local_950._24_8_,(Prim *)prim_00,&local_840,value,err,
                               visited_paths);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                       ,0x5c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_7c0,"GetTerminalAttributeImpl",0x18);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"():",3);
            poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_7c0,0xafe);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
            local_800._M_p = (pointer)&local_7f0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_800,
                       "Circular referencing detected. connectionTargetPath = {}","");
            tinyusdz::to_string_abi_cxx11_
                      (&local_648,(tinyusdz *)local_910,(Path *)0x1,SUB81(pbVar4,0));
            fmt::format<std::__cxx11::string>
                      (&local_820,(fmt *)&local_800,(string *)&local_648,pbVar4);
            poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_7c0,local_820._M_dataplus._M_p,
                                local_820._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_820._M_dataplus._M_p != &local_820.field_2) {
              operator_delete(local_820._M_dataplus._M_p,local_820.field_2._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_648._M_dataplus._M_p != &local_648.field_2) {
              operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_800._M_p != &local_7f0) {
              operator_delete(local_800._M_p,local_7f0._M_allocated_capacity + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)err,(ulong)local_820._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_820._M_dataplus._M_p != &local_820.field_2) {
                operator_delete(local_820._M_dataplus._M_p,local_820.field_2._0_8_ + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c0);
            ::std::ios_base::~ios_base((ios_base *)local_750._M_local_buf);
            bVar1 = false;
          }
          if ((undefined1 *)local_950._32_8_ != local_950 + 0x30) {
            operator_delete((void *)local_950._32_8_,local_950._48_8_ + 1);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                     ,0x5c);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_7c0,"GetTerminalAttributeImpl",0x18);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"():",3);
          poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_7c0,0xb06);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          if (local_950[0x10] == '\x01') {
            __assert_fail("! has_value()",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                          ,0x881,
                          "error_type &nonstd::expected_lite::expected<const tinyusdz::Prim *, std::basic_string<char>>::error() & [T = const tinyusdz::Prim *, E = std::basic_string<char>]"
                         );
          }
          poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_7c0,(char *)local_960._0_8_,local_960._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)err,local_950._32_8_);
            if ((undefined1 *)local_950._32_8_ != local_950 + 0x30) {
              operator_delete((void *)local_950._32_8_,local_950._48_8_ + 1);
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c0);
          ::std::ios_base::~ios_base((ios_base *)local_750._M_local_buf);
          bVar1 = false;
        }
        if ((local_950[0x10] == '\0') && ((Prim *)local_960._0_8_ != (Prim *)local_950)) {
          operator_delete((void *)local_960._0_8_,(ulong)(local_950._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_840._M_dataplus._M_p != &local_840.field_2) {
          operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
          operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_910._160_8_ != local_860) {
          operator_delete((void *)local_910._160_8_,(ulong)(local_860[0]._M_allocated_capacity + 1))
          ;
        }
        if (local_910._128_8_ != (long)local_910 + 0x90) {
          operator_delete((void *)local_910._128_8_,(ulong)(local_910._144_8_ + 1));
        }
        if ((undefined1 *)local_910._96_8_ != local_910 + 0x70) {
          operator_delete((void *)local_910._96_8_,local_910._112_8_ + 1);
        }
        if ((undefined1 *)local_910._64_8_ != local_910 + 0x50) {
          operator_delete((void *)local_910._64_8_,local_910._80_8_ + 1);
        }
        if ((undefined1 *)local_910._32_8_ != local_910 + 0x30) {
          operator_delete((void *)local_910._32_8_,local_910._48_8_ + 1);
        }
        if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
          operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
        }
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_628);
      goto LAB_003228ea;
    }
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(local_610._type & ~Attrib);
    if ((local_610._type & ~Attrib) == Relation) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_7c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                 ,0x5c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_7c0,"GetTerminalAttributeImpl",0x18);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"():",3);
      poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_7c0,0xb0a);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      pcVar6 = "Property `{}` is a Relation.";
      pcVar5 = "";
    }
    else {
      if (local_610._type == Attrib) {
        ::std::__cxx11::string::_M_assign((string *)value);
        value->_varying_authored = local_610._attrib._varying_authored;
        value->_variability = local_610._attrib._variability;
        ::std::__cxx11::string::_M_assign((string *)&value->_type_name);
        linb::any::operator=((any *)&value->_var,(any *)&local_610._attrib._var);
        (value->_var)._blocked = local_610._attrib._var._blocked;
        ::std::
        vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ::operator=(&(value->_var)._ts._samples,&local_610._attrib._var._ts._samples);
        (value->_var)._ts._dirty = local_610._attrib._var._ts._dirty;
        std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&value->_paths,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                   &local_610._attrib._paths);
        AttrMetas::operator=(&value->_metas,&local_610._attrib._metas);
        bVar1 = true;
        goto LAB_003228ea;
      }
      if (local_610._type == EmptyAttrib) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7c0,"GetTerminalAttributeImpl",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"():",3);
        poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_7c0,0xb0e);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        pcVar6 = "Attribute `{}` is a define-only attribute(no value assigned).";
        pcVar5 = "";
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7c0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                   ,0x5c);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_7c0,"GetTerminalAttributeImpl",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_7c0,"():",3);
        poVar2 = (ostream *)::std::ostream::operator<<((ostringstream *)local_7c0,0xb15);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        pcVar6 = "[InternalError] Invalid Attribute `{}`.";
        pcVar5 = "";
      }
    }
    local_960._0_8_ = (Prim *)local_950;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_960,pcVar6,pcVar5);
    fmt::format<std::__cxx11::string>
              ((string *)local_910,(fmt *)local_960,(string *)attr_name,pbVar4);
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_7c0,(char *)local_910._0_8_,local_910._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
      operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
    }
    if ((Prim *)local_960._0_8_ != (Prim *)local_950) {
      operator_delete((void *)local_960._0_8_,(ulong)(local_950._0_8_ + 1));
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_910._0_8_);
      if ((undefined1 *)local_910._0_8_ != local_910 + 0x10) {
        operator_delete((void *)local_910._0_8_,local_910._16_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7c0);
    ::std::ios_base::~ios_base((ios_base *)local_750._M_local_buf);
  }
  bVar1 = false;
LAB_003228ea:
  Property::~Property(&local_610);
  return bVar1;
}

Assistant:

bool GetTerminalAttributeImpl(const tinyusdz::Stage &stage,
                              const tinyusdz::Prim &prim,
                              const std::string &attr_name, Attribute *value,
                              std::string *err,
                              std::set<std::string> &visited_paths) {
  DCOUT("Prim : " << prim.element_path().element_name() << "("
                  << prim.type_name() << ") attr_name " << attr_name);

  Property prop;
  if (!GetProperty(prim, attr_name, &prop, err)) {
    return false;
  }

  if (prop.is_attribute_connection()) {
    // Follow connection target Path(singple targetPath only).
    std::vector<Path> pv = prop.get_attribute().connections();
    if (pv.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Connection targetPath is empty for Attribute {}.", attr_name));
    }

    if (pv.size() > 1) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Multiple targetPaths assigned to .connection."));
    }

    auto target = pv[0];

    std::string targetPrimPath = target.prim_part();
    std::string targetPrimPropName = target.prop_part();
    DCOUT("connection targetPath : " << target << "(Prim: " << targetPrimPath
                                     << ", Prop: " << targetPrimPropName
                                     << ")");

    auto targetPrimRet =
        stage.GetPrimAtPath(Path(targetPrimPath, /* prop */ ""));
    if (targetPrimRet) {
      // Follow the connetion
      const Prim *targetPrim = targetPrimRet.value();

      std::string abs_path = target.full_path_name();

      if (visited_paths.count(abs_path)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Circular referencing detected. connectionTargetPath = {}",
            to_string(target)));
      }
      visited_paths.insert(abs_path);

      return GetTerminalAttributeImpl(stage, *targetPrim, targetPrimPropName,
                                      value, err, visited_paths);

    } else {
      PUSH_ERROR_AND_RETURN(targetPrimRet.error());
    }
  } else if (prop.is_relationship()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Property `{}` is a Relation.", attr_name));
  } else if (prop.is_empty()) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "Attribute `{}` is a define-only attribute(no value assigned).",
        attr_name));
  } else if (prop.is_attribute()) {
    (*value) = prop.get_attribute();

  } else {
    // ???
    PUSH_ERROR_AND_RETURN(
        fmt::format("[InternalError] Invalid Attribute `{}`.", attr_name));
  }

  return true;
}